

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkSetMaxErrTestFails(void *arkode_mem,int maxnef)

{
  int in_ESI;
  long in_RDI;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSetMaxErrTestFails",
                    "arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    if (in_ESI < 1) {
      *(undefined4 *)(in_RDI + 0x1c8) = 7;
    }
    else {
      *(int *)(in_RDI + 0x1c8) = in_ESI;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkSetMaxErrTestFails(void *arkode_mem, int maxnef)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetMaxErrTestFails", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* argument <= 0 sets default, otherwise set input */
  if (maxnef <= 0) {
    ark_mem->maxnef = MAXNEF;
  } else {
    ark_mem->maxnef = maxnef;
  }
  return(ARK_SUCCESS);
}